

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void duckdb::StringValueResult::InvalidState(StringValueResult *result)

{
  CSVReaderOptions *pCVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  byte reconstruct_line;
  ulong uVar5;
  LinesPerBoundary error_info;
  string *current_path;
  bool first_nl;
  idx_t local_1a0;
  idx_t local_198;
  CSVReaderOptions *local_190;
  optional_idx local_188;
  LinesPerBoundary lines_per_batch;
  string borked_line;
  CSVError error;
  CSVError csv_error;
  
  if ((result->super_ScannerResult).quoted == true) {
    csv_error.error_message._M_dataplus._M_p._0_1_ = 4;
    LineError::Insert(&result->current_errors,(CSVErrorType *)&csv_error,&result->cur_col_id,
                      &result->chunk_col_id,&(result->super_ScannerResult).last_position,0);
  }
  else {
    LinesPerBoundary::LinesPerBoundary
              (&lines_per_batch,(result->iterator->boundary).boundary_idx,*result->lines_read);
    first_nl = false;
    if ((result->super_ScannerResult).result_size == 1) {
      reconstruct_line = false;
    }
    else {
      pCVar1 = ((result->super_ScannerResult).state_machine)->options;
      reconstruct_line = true;
      if ((pCVar1->store_rejects).value == false) {
        reconstruct_line = (pCVar1->ignore_errors).value ^ 1;
      }
    }
    FullLinePosition::
    ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
              (&borked_line,&result->current_line_position,&first_nl,&result->buffer_handles,
               (bool)reconstruct_line);
    CSVError::CSVError(&csv_error);
    local_190 = (CSVReaderOptions *)result->cur_col_id;
    pCVar1 = ((result->super_ScannerResult).state_machine)->options;
    local_198 = lines_per_batch.boundary_idx;
    local_1a0 = lines_per_batch.lines_in_batch;
    iVar2 = result->requested_size;
    uVar5 = (ulong)first_nl;
    iVar3 = (result->current_line_position).begin.buffer_idx;
    iVar4 = (result->current_line_position).begin.buffer_pos;
    current_path = (string *)0x17e963c;
    optional_idx::optional_idx
              (&local_188,
               (result->super_ScannerResult).last_position.buffer_pos + uVar5 +
               (result->super_ScannerResult).last_position.buffer_idx * iVar2);
    error_info.lines_in_batch = (idx_t)&borked_line;
    error_info.boundary_idx = local_1a0;
    CSVError::InvalidState
              (&error,(CSVError *)pCVar1,local_190,local_198,error_info,
               (string *)(iVar3 * iVar2 + iVar4 + uVar5),local_188.index,(optional_idx)&result->path
               ,current_path);
    CSVErrorHandler::Error(result->error_handler,&error,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error.csv_row._M_dataplus._M_p != &error.csv_row.field_2) {
      operator_delete(error.csv_row._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error.full_error_message._M_dataplus._M_p != &error.full_error_message.field_2) {
      operator_delete(error.full_error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error.error_message._M_dataplus._M_p != &error.error_message.field_2) {
      operator_delete(error.error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)csv_error.csv_row._M_dataplus._M_p != &csv_error.csv_row.field_2) {
      operator_delete(csv_error.csv_row._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)csv_error.full_error_message._M_dataplus._M_p != &csv_error.full_error_message.field_2) {
      operator_delete(csv_error.full_error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(csv_error.error_message._M_dataplus._M_p._1_7_,
                    csv_error.error_message._M_dataplus._M_p._0_1_) !=
        &csv_error.error_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(csv_error.error_message._M_dataplus._M_p._1_7_,
                               csv_error.error_message._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)borked_line._M_dataplus._M_p != &borked_line.field_2) {
      operator_delete(borked_line._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void StringValueResult::InvalidState(StringValueResult &result) {
	if (result.quoted) {
		result.current_errors.Insert(UNTERMINATED_QUOTES, result.cur_col_id, result.chunk_col_id, result.last_position);
	} else {
		LinesPerBoundary lines_per_batch(result.iterator.GetBoundaryIdx(), result.lines_read);
		bool first_nl = false;
		auto borked_line = result.current_line_position.ReconstructCurrentLine(first_nl, result.buffer_handles,
		                                                                       result.PrintErrorLine());
		CSVError csv_error;
		auto error = CSVError::InvalidState(
		    result.state_machine.options, result.cur_col_id, lines_per_batch, borked_line,
		    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
		    result.last_position.GetGlobalPosition(result.requested_size, first_nl), result.path);
		result.error_handler.Error(error, true);
	}
}